

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O1

void __thiscall Liby::TcpServer::handleAcceptEvent(TcpServer *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *chan;
  Connection *pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined8 uVar3;
  _Any_data *in_RCX;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ConnPtr connPtr;
  SockPtr sock;
  undefined1 local_99 [9];
  Connection *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  int local_7c;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  Socket local_50;
  
  if (this->listenfd_ < 0) {
    __assert_fail("listenfd_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp"
                  ,0x23,"void Liby::TcpServer::handleAcceptEvent()");
  }
  do {
    Socket::accept(&local_50,
                   (int)(this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,in_RDX,(socklen_t *)in_RCX->_M_pod_data);
    uVar3 = local_50._0_8_;
    in_RDX = extraout_RDX;
    if (local_50._0_8_ != 0) {
      if (this->loop_ == (EventLoop *)0x0) {
        __assert_fail("sock && loop_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp"
                      ,0x2a,"void Liby::TcpServer::handleAcceptEvent()");
      }
      local_78._M_unused._M_object = EventLoop::robinLoop(this->loop_,*(int *)(local_50._0_8_ + 4));
      local_90 = (Connection *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Liby::Connection,std::allocator<Liby::Connection>,Liby::EventLoop*,std::shared_ptr<Liby::Socket>&>
                (&local_88,&local_90,(allocator<Liby::Connection> *)&local_7c,
                 (EventLoop **)&local_78,(shared_ptr<Liby::Socket> *)&local_50);
      std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<Liby::Connection,Liby::Connection>
                ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)&local_90,local_90);
      initConnection(this,local_90);
      pCVar1 = local_90;
      chan = &local_50.fp_.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      if (local_90->poller_ == (Poller *)0x0) {
        __assert_fail("poller_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.h"
                      ,0x28,"Poller *Liby::Connection::getPoller()");
      }
      local_7c = *(int *)(local_50._0_8_ + 4);
      local_50.fp_.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      in_RCX = &local_78;
      local_78._M_unused._M_object = local_90->poller_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Liby::Channel,std::allocator<Liby::Channel>,Liby::Poller*,int>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50.ep_,(Channel **)chan,
                 (allocator<Liby::Channel> *)local_99,(Poller **)&local_78,&local_7c);
      Connection::setChannel(pCVar1,(ChanPtr *)chan);
      if (local_50.ep_ != (Endpoint)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.ep_);
      }
      _Var2._M_pi = local_88._M_pi;
      pCVar1 = local_90;
      if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
        }
      }
      local_68 = (code *)0x0;
      pcStack_60 = (code *)0x0;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_78._M_unused._M_object = operator_new(0x18);
      *(TcpServer **)local_78._M_unused._0_8_ = this;
      *(Connection **)((long)local_78._M_unused._0_8_ + 8) = pCVar1;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78._M_unused._0_8_ + 0x10) =
           _Var2._M_pi;
      pcStack_60 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:48:38)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:48:38)>
                 ::_M_manager;
      Connection::runEventHandler(pCVar1,(BasicHandler *)&local_78);
      in_RDX = extraout_RDX_00;
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
        in_RDX = extraout_RDX_01;
      }
      if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
        in_RDX = extraout_RDX_02;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_50.fp_.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_50.fp_.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      in_RDX = extraout_RDX_03;
    }
    if (uVar3 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void TcpServer::handleAcceptEvent() {
    assert(listenfd_ >= 0);
    for (;;) {
        try {
            auto sock = socket_->accept();
            if (!sock) {
                return;
            }
            assert(sock && loop_);
            ConnPtr connPtr = std::make_shared<Connection>(
                loop_->robinLoop(sock->fd()), sock);
            initConnection(*connPtr);
            connPtr->setChannel(
                std::make_shared<Channel>(connPtr->getPoller(), sock->fd()));
            connPtr->runEventHandler([this, connPtr] {
                connPtr->init();
                connPtr->init1();
                connPtr->enableRead();
                if (acceptorCallback_) {
                    acceptorCallback_(*connPtr);
                }
            });
        } catch (const char *err) {
            debug("accept: %s", err);
            handleErroEvent();
        }
    }
}